

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffcrhd(fitsfile *fptr,int *status)

{
  int iVar1;
  fitsfile *in_RSI;
  int *in_RDI;
  LONGLONG *ptr;
  LONGLONG bytepos;
  int tstatus;
  fitsfile *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  int hdumov;
  int local_4;
  
  hdumov = 0;
  if (in_RSI->HDUposition < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,&in_stack_00000030->HDUposition);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x70) ==
        *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) {
      local_4 = in_RSI->HDUposition;
    }
    else {
      do {
        iVar1 = ffmrhd(in_RSI,hdumov,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      } while (iVar1 == 0);
      if (*(int *)(*(long *)(in_RDI + 2) + 0x60) == *(int *)(*(long *)(in_RDI + 2) + 100)) {
        in_stack_ffffffffffffffd0 =
             (int *)realloc(*(void **)(*(long *)(in_RDI + 2) + 0x68),
                            (long)(*(int *)(*(long *)(in_RDI + 2) + 100) + 0x3e9) << 3);
        if (in_stack_ffffffffffffffd0 == (int *)0x0) {
          in_RSI->HDUposition = 0x71;
          return 0x71;
        }
        *(int *)(*(long *)(in_RDI + 2) + 100) = *(int *)(*(long *)(in_RDI + 2) + 100) + 1000;
        *(int **)(*(long *)(in_RDI + 2) + 0x68) = in_stack_ffffffffffffffd0;
      }
      iVar1 = ffchdu(in_stack_00000030,&fptr->HDUposition);
      if (iVar1 < 1) {
        uVar2 = *(undefined8 *)
                 (*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)(*(int *)(*(long *)(in_RDI + 2) + 0x60) + 1) * 8);
        ffmbyt(in_RSI,CONCAT44(hdumov,in_stack_ffffffffffffffe0),(int)((ulong)uVar2 >> 0x20),
               in_stack_ffffffffffffffd0);
        *(int *)(*(long *)(in_RDI + 2) + 0x60) = *(int *)(*(long *)(in_RDI + 2) + 0x60) + 1;
        *(undefined4 *)(*(long *)(in_RDI + 2) + 0x54) =
             *(undefined4 *)(*(long *)(in_RDI + 2) + 0x60);
        *in_RDI = *(int *)(*(long *)(in_RDI + 2) + 0x60);
        *(undefined8 *)(*(long *)(in_RDI + 2) + 0x80) = uVar2;
        *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) = uVar2;
        *(undefined8 *)(*(long *)(in_RDI + 2) + 0x88) = 0xffffffffffffffff;
        *(undefined4 *)(*(long *)(in_RDI + 2) + 0x478) =
             *(undefined4 *)(*(long *)(in_RDI + 2) + 0x428);
      }
      local_4 = in_RSI->HDUposition;
    }
  }
  else {
    local_4 = in_RSI->HDUposition;
  }
  return local_4;
}

Assistant:

int ffcrhd(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  CReate Header Data unit:  Create, initialize, and move the i/o pointer
  to a new extension appended to the end of the FITS file.
*/
{
    int  tstatus = 0;
    LONGLONG bytepos, *ptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* If the current header is empty, we don't have to do anything */
    if ((fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status);

    while (ffmrhd(fptr, 1, 0, &tstatus) == 0);  /* move to end of file */

    if ((fptr->Fptr)->maxhdu == (fptr->Fptr)->MAXHDU)
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        ((fptr->Fptr)->MAXHDU + 1001) * sizeof(LONGLONG) );

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = (fptr->Fptr)->MAXHDU + 1000;
          (fptr->Fptr)->headstart = ptr;
        }
    }

    if (ffchdu(fptr, status) <= 0)  /* close the current HDU */
    {
      bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1]; /* last */
      ffmbyt(fptr, bytepos, IGNORE_EOF, status);  /* move file ptr to it */
      (fptr->Fptr)->maxhdu++;       /* increment the known number of HDUs */
      (fptr->Fptr)->curhdu = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      fptr->HDUposition    = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      (fptr->Fptr)->nextkey = bytepos;    /* next keyword = start of header */
      (fptr->Fptr)->headend = bytepos;          /* end of header */
      (fptr->Fptr)->datastart = DATA_UNDEFINED; /* start data unit undefined */

       /* any other needed resets */
       
       /* reset the dithering offset that may have been calculated for the */
       /* previous HDU back to the requested default value */
       (fptr->Fptr)->dither_seed = (fptr->Fptr)->request_dither_seed;
    }

    return(*status);
}